

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O1

DOMNode * __thiscall xercesc_4_0::DOMNormalizer::normalizeNode(DOMNormalizer *this,DOMNode *node)

{
  DOMDocumentImpl *pDVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  undefined4 extraout_var_00;
  DOMNode *pDVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined8 uVar9;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  DOMNode *pDVar10;
  ulong uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  iVar3 = (*node->_vptr_DOMNode[4])(node);
  switch(iVar3) {
  case 1:
    InScopeNamespaces::addScope(this->fNSScope,this->fMemoryManager);
    iVar3 = (*node->_vptr_DOMNode[0xb])(node);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if ((this->fConfiguration->featureValues & 0x80) == 0) {
      if ((plVar4 != (long *)0x0) && (lVar5 = (**(code **)(*plVar4 + 0x28))(plVar4), lVar5 != 0)) {
        uVar11 = 0;
        do {
          plVar6 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,uVar11);
          (**(code **)(*plVar6 + 0xa0))(plVar6);
          uVar11 = uVar11 + 1;
          uVar7 = (**(code **)(*plVar4 + 0x28))(plVar4);
        } while (uVar11 < uVar7);
      }
    }
    else {
      namespaceFixUp(this,(DOMElementImpl *)node);
    }
    iVar3 = (*node->_vptr_DOMNode[7])(node);
    pDVar8 = (DOMNode *)CONCAT44(extraout_var_10,iVar3);
    while (pDVar8 != (DOMNode *)0x0) {
      iVar3 = (*pDVar8->_vptr_DOMNode[10])(pDVar8);
      pDVar10 = normalizeNode(this,pDVar8);
      pDVar8 = (DOMNode *)CONCAT44(extraout_var_11,iVar3);
      if (pDVar10 != (DOMNode *)0x0) {
        pDVar8 = pDVar10;
      }
    }
    InScopeNamespaces::removeScope(this->fNSScope);
    break;
  case 3:
    iVar3 = (*node->_vptr_DOMNode[10])(node);
    plVar4 = (long *)CONCAT44(extraout_var_04,iVar3);
    if ((plVar4 != (long *)0x0) && (iVar3 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar3 == 3)) {
      uVar9 = (**(code **)(*plVar4 + 0x18))(plVar4);
      (*node->_vptr_DOMNode[0x2b])(node,uVar9);
      iVar3 = (*node->_vptr_DOMNode[5])(node);
      (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x80))
                ((long *)CONCAT44(extraout_var_05,iVar3),plVar4);
      return node;
    }
    iVar3 = (*node->_vptr_DOMNode[3])(node);
    if (((short *)CONCAT44(extraout_var_08,iVar3) == (short *)0x0) ||
       (*(short *)CONCAT44(extraout_var_08,iVar3) == 0)) {
      iVar3 = (*node->_vptr_DOMNode[5])(node);
      (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x80))
                ((long *)CONCAT44(extraout_var_09,iVar3),node);
    }
    break;
  case 4:
    if ((this->fConfiguration->featureValues & 2) == 0) {
      pDVar1 = this->fDocument;
      iVar3 = (*node->_vptr_DOMNode[3])(node);
      iVar3 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3e])
                        (pDVar1,CONCAT44(extraout_var_00,iVar3));
      pDVar8 = (DOMNode *)CONCAT44(extraout_var_01,iVar3);
      iVar3 = (*node->_vptr_DOMNode[5])(node);
      plVar4 = (long *)CONCAT44(extraout_var_02,iVar3);
      iVar3 = (*node->_vptr_DOMNode[9])(node);
      plVar6 = (long *)CONCAT44(extraout_var_03,iVar3);
      (**(code **)(*plVar4 + 0x78))(plVar4,pDVar8,node);
      if (plVar6 == (long *)0x0) {
        return pDVar8;
      }
      iVar3 = (**(code **)(*plVar6 + 0x20))(plVar6);
      if (iVar3 != 3) {
        return pDVar8;
      }
      uVar9 = (**(code **)(*plVar6 + 0x18))(plVar6);
      (*pDVar8->_vptr_DOMNode[0x2c])(pDVar8,0,uVar9);
      (**(code **)(*plVar4 + 0x80))(plVar4,plVar6);
      return pDVar8;
    }
    break;
  case 8:
    if ((this->fConfiguration->featureValues & 4) == 0) {
      iVar3 = (*node->_vptr_DOMNode[9])(node);
      plVar4 = (long *)CONCAT44(extraout_var_06,iVar3);
      iVar3 = (*node->_vptr_DOMNode[5])(node);
      plVar6 = (long *)CONCAT44(extraout_var_07,iVar3);
      (**(code **)(*plVar6 + 0x80))(plVar6,node);
      bVar2 = true;
      if ((((plVar4 != (long *)0x0) && (iVar3 = (**(code **)(*plVar4 + 0x20))(plVar4), iVar3 == 3))
          && (this = (DOMNormalizer *)(**(code **)(*plVar4 + 0x50))(plVar4),
             this != (DOMNormalizer *)0x0)) &&
         (iVar3 = (*(code *)(this->fDocument->super_DOMDocument).super_DOMNode._vptr_DOMNode)(this),
         iVar3 == 3)) {
        uVar9 = (**(code **)(*plVar4 + 0x18))(plVar4);
        bVar2 = false;
        (*(code *)this->fDocument->fMemoryManager)(this,0,uVar9);
        (**(code **)(*plVar6 + 0x80))(plVar6,plVar4);
      }
      if (!bVar2) {
        return (DOMNode *)this;
      }
    }
  }
  return (DOMNode *)0x0;
}

Assistant:

DOMNode * DOMNormalizer::normalizeNode(DOMNode *node) const {
    switch(node->getNodeType()) {
    case DOMNode::ELEMENT_NODE: {
        fNSScope->addScope(fMemoryManager);
        DOMNamedNodeMap *attrMap = node->getAttributes();

        if(fConfiguration->featureValues & DOMConfigurationImpl::FEATURE_NAMESPACES) {
            namespaceFixUp((DOMElementImpl*)node);
        }
        else {
            //this is done in namespace fixup so no need to do it if namespace is on
            if(attrMap) {
                for(XMLSize_t i = 0; i < attrMap->getLength(); i++) {
                    attrMap->item(i)->normalize();
                }
            }
        }

        DOMNode *child = node->getFirstChild();
        DOMNode *next = 0;
        for (; child != 0; child = next) {
            next = child->getNextSibling();
            child = normalizeNode(child);
            if(child != 0) {
                next = child;
            }
        }
        fNSScope->removeScope();
        break;
    }
    case DOMNode::COMMENT_NODE: {
        if (!(fConfiguration->featureValues & DOMConfigurationImpl::FEATURE_COMMENTS)) {
            DOMNode *prevSibling = node->getPreviousSibling();
            DOMNode *parent = node->getParentNode();
            // remove the comment node
            parent->removeChild(node);
            if (prevSibling != 0 && prevSibling->getNodeType() == DOMNode::TEXT_NODE) {
                DOMNode *nextSibling = prevSibling->getNextSibling();
                if (nextSibling != 0 && nextSibling->getNodeType() == DOMNode::TEXT_NODE) {
                    ((DOMTextImpl*)nextSibling)->insertData(0, prevSibling->getNodeValue());
                    parent->removeChild(prevSibling);
                    return nextSibling;
                }
            }
        }
        break;
    }
    case DOMNode::CDATA_SECTION_NODE: {
        if (!(fConfiguration->featureValues & DOMConfigurationImpl::FEATURE_CDATA_SECTIONS)) {
            // convert CDATA to TEXT nodes
            DOMText *text = fDocument->createTextNode(node->getNodeValue());
            DOMNode *parent = node->getParentNode();
            DOMNode *prevSibling = node->getPreviousSibling();
            node = parent->replaceChild(text, node);
            if (prevSibling != 0 && prevSibling->getNodeType() == DOMNode::TEXT_NODE) {
                text->insertData(0, prevSibling->getNodeValue());
                parent->removeChild(prevSibling);
            }
            return text; // Don't advance;
        }
        break;
    }
    case DOMNode::TEXT_NODE: {
        DOMNode *next = node->getNextSibling();

        if(next != 0 && next->getNodeType() == DOMNode::TEXT_NODE) {
            ((DOMText*)node)->appendData(next->getNodeValue());
            node->getParentNode()->removeChild(next);
            return node;
        } else {
            const XMLCh* nv = node->getNodeValue();
            if (nv == 0 || *nv == 0) {
                node->getParentNode()->removeChild(node);
            }
        }
    }
    default:
        break;
    }

    return 0;
}